

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O3

bool bssl::ext_sct_add_clienthello
               (SSL_HANDSHAKE *hs,CBB *out,CBB *out_compressible,ssl_client_hello_type_t type)

{
  int iVar1;
  bool bVar2;
  
  bVar2 = true;
  if ((hs->config->field_0x10d & 2) != 0) {
    iVar1 = CBB_add_u16(out_compressible,0x12);
    if (iVar1 == 0) {
      bVar2 = false;
    }
    else {
      iVar1 = CBB_add_u16(out_compressible,0);
      bVar2 = iVar1 != 0;
    }
  }
  return bVar2;
}

Assistant:

static bool ext_sct_add_clienthello(const SSL_HANDSHAKE *hs, CBB *out,
                                    CBB *out_compressible,
                                    ssl_client_hello_type_t type) {
  if (!hs->config->signed_cert_timestamps_enabled) {
    return true;
  }

  if (!CBB_add_u16(out_compressible, TLSEXT_TYPE_certificate_timestamp) ||
      !CBB_add_u16(out_compressible, 0 /* length */)) {
    return false;
  }

  return true;
}